

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

void av1_set_mv_search_range(FullMvLimits *mv_limits,MV *mv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar3 = mv->col + 7 >> 3;
  iVar5 = mv->row + 7 >> 3;
  iVar1 = (int)mv->col >> 3;
  iVar2 = (int)mv->row >> 3;
  if (iVar3 < -0x3ff) {
    iVar3 = -0x400;
  }
  if (iVar5 < -0x3ff) {
    iVar5 = -0x400;
  }
  if (0x3ff < iVar1) {
    iVar1 = 0x400;
  }
  if (0x3ff < iVar2) {
    iVar2 = 0x400;
  }
  iVar4 = iVar3 + -0x3ff;
  if (iVar3 + -0x3ff < mv_limits->col_min) {
    iVar4 = mv_limits->col_min;
  }
  mv_limits->col_min = iVar4;
  iVar3 = iVar1 + 0x3ff;
  if (mv_limits->col_max < iVar1 + 0x3ff) {
    iVar3 = mv_limits->col_max;
  }
  iVar1 = iVar5 + -0x3ff;
  if (iVar5 + -0x3ff < mv_limits->row_min) {
    iVar1 = mv_limits->row_min;
  }
  mv_limits->row_min = iVar1;
  iVar5 = iVar2 + 0x3ff;
  if (mv_limits->row_max < iVar2 + 0x3ff) {
    iVar5 = mv_limits->row_max;
  }
  if (iVar3 < iVar4) {
    iVar3 = iVar4;
  }
  mv_limits->col_max = iVar3;
  if (iVar5 < iVar1) {
    iVar5 = iVar1;
  }
  mv_limits->row_max = iVar5;
  return;
}

Assistant:

void av1_set_mv_search_range(FullMvLimits *mv_limits, const MV *mv) {
  // Calculate the outermost full-pixel MVs which are inside the limits set by
  // av1_set_subpel_mv_search_range().
  //
  // The subpel limits are simply mv->col +/- 8*MAX_FULL_PEL_VAL, and similar
  // for mv->row. We can then divide by 8 to find the fullpel MV limits. But
  // we have to be careful about the rounding. We want these bounds to be
  // at least as tight as the subpel limits, which means that we must round
  // the minimum values up and the maximum values down when dividing.
  int col_min = ((mv->col + 7) >> 3) - MAX_FULL_PEL_VAL;
  int row_min = ((mv->row + 7) >> 3) - MAX_FULL_PEL_VAL;
  int col_max = (mv->col >> 3) + MAX_FULL_PEL_VAL;
  int row_max = (mv->row >> 3) + MAX_FULL_PEL_VAL;

  col_min = AOMMAX(col_min, (MV_LOW >> 3) + 1);
  row_min = AOMMAX(row_min, (MV_LOW >> 3) + 1);
  col_max = AOMMIN(col_max, (MV_UPP >> 3) - 1);
  row_max = AOMMIN(row_max, (MV_UPP >> 3) - 1);

  // Get intersection of UMV window and valid MV window to reduce # of checks
  // in diamond search.
  mv_limits->col_min = AOMMAX(mv_limits->col_min, col_min);
  mv_limits->col_max = AOMMIN(mv_limits->col_max, col_max);
  mv_limits->row_min = AOMMAX(mv_limits->row_min, row_min);
  mv_limits->row_max = AOMMIN(mv_limits->row_max, row_max);

  mv_limits->col_max = AOMMAX(mv_limits->col_min, mv_limits->col_max);
  mv_limits->row_max = AOMMAX(mv_limits->row_min, mv_limits->row_max);
}